

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.h
# Opt level: O0

void __thiscall Options::~Options(Options *this)

{
  string *local_18;
  Options *this_local;
  
  ReportFields::~ReportFields(&this->reportFields);
  local_18 = (string *)this->indexOptions;
  do {
    local_18 = local_18 + -0x20;
    std::__cxx11::string::~string(local_18);
  } while ((Options *)local_18 != this);
  return;
}

Assistant:

~Options() {}